

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::IfExpr::IfExpr
          (IfExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *condition,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *thenBody,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *elseBody,
          Token *keyword)

{
  Token *keyword_local;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *elseBody_local;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *thenBody_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *condition_local;
  IfExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__IfExpr_0016a2a8;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
            (&this->condition,condition);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
            (&this->thenBody,thenBody);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
            (&this->elseBody,elseBody);
  Token::Token(&this->keyword,keyword);
  return;
}

Assistant:

IfExpr(std::unique_ptr<Expr> condition,
               std::unique_ptr<BlockExpr> thenBody,
               std::unique_ptr<BlockExpr> elseBody,
               Token keyword) :
                condition{std::move(condition)},
                thenBody{std::move(thenBody)},
                elseBody{std::move(elseBody)},
                keyword{std::move(keyword)} {}